

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt4Check(int t)

{
  uint t_00;
  int iVar1;
  int iVar2;
  int tn;
  int Count;
  int t_local;
  
  t_00 = (t ^ 0xffffffffU) & 0xffff;
  if ((t == 0x6996) || (t_00 == 0x6996)) {
    Count = 1;
  }
  else if ((t & t - 1U) == 0) {
    Count = 1;
  }
  else if ((t_00 & t_00 - 1) == 0) {
    Count = 1;
  }
  else {
    iVar1 = Abc_Tt4CountOnes(t);
    if ((iVar1 == 7) && (iVar2 = Abc_Tt4CheckTwoLevel(t), 0 < iVar2)) {
      return 1;
    }
    if ((iVar1 == 9) && (iVar1 = Abc_Tt4CheckTwoLevel(t_00), 0 < iVar1)) {
      return 1;
    }
    Count = 0;
  }
  return Count;
}

Assistant:

static inline int Abc_Tt4Check( int t )
{
    int Count, tn = 0xFFFF & ~t;
    if ( t == 0x6996 || tn == 0x6996 ) return 1;
    if ( (t & (t-1)) == 0 )            return 1;
    if ( (tn & (tn-1)) == 0 )          return 1;
    Count = Abc_Tt4CountOnes( t );
    if ( Count == 7 && Abc_Tt4CheckTwoLevel(t)  > 0 ) return 1;
    if ( Count == 9 && Abc_Tt4CheckTwoLevel(tn) > 0 ) return 1;
    return 0;
}